

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::OptimizeIndirUses
          (GlobOpt *this,IndirOpnd *indirOpnd,Instr **pInstr,Value **indirIndexValRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  
  if ((indirIndexValRef != (Value **)0x0) && (*indirIndexValRef != (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4095,"(!indirIndexValRef || !*indirIndexValRef)",
                       "!indirIndexValRef || !*indirIndexValRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  OptSrc(this,&indirOpnd->m_baseOpnd->super_Opnd,pInstr,(Value **)0x0,indirOpnd);
  if (indirOpnd->m_indexOpnd != (RegOpnd *)0x0) {
    pVVar4 = OptSrc(this,&indirOpnd->m_indexOpnd->super_Opnd,pInstr,(Value **)0x0,indirOpnd);
    if (indirIndexValRef != (Value **)0x0) {
      *indirIndexValRef = pVVar4;
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptimizeIndirUses(IR::IndirOpnd *indirOpnd, IR::Instr * *pInstr, Value **indirIndexValRef)
{
    IR::Instr * &instr = *pInstr;
    Assert(!indirIndexValRef || !*indirIndexValRef);

    // Update value types and copy-prop the base
    OptSrc(indirOpnd->GetBaseOpnd(), &instr, nullptr, indirOpnd);

    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    if (!indexOpnd)
    {
        return;
    }

    // Update value types and copy-prop the index
    Value *indexVal = OptSrc(indexOpnd, &instr, nullptr, indirOpnd);
    if(indirIndexValRef)
    {
        *indirIndexValRef = indexVal;
    }
}